

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O0

void FileSystemTest::SetUpTestCase(void)

{
  byte bVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  string local_248;
  AssertionHelper local_228;
  Fixed local_1f8;
  path local_60;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult iutest_ar;
  
  iutest::detail::AlwaysZero();
  std::filesystem::__cxx11::path::path<char[21],std::filesystem::__cxx11::path>
            (&local_60,(char (*) [21])"./testdata/empty.bin",auto_format);
  bVar1 = std::filesystem::copy_file(&local_60,&largefile_abi_cxx11_,overwrite_existing);
  local_31 = (bool)(bVar1 & 1);
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_30,&local_31);
  std::filesystem::__cxx11::path::~path(&local_60);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    memset(&local_1f8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_248,(internal *)local_30,
               (AssertionResult *)
               "::std::filesystem::copy_file(\"./testdata/empty.bin\", largefile, ::std::filesystem::copy_options::overwrite_existing)"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x54,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_228,&local_1f8);
    iutest::AssertionHelper::~AssertionHelper(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

static void SetUpTestCase(void)
    {
        IUTEST_ASSERT_TRUE(::std::filesystem::copy_file("./testdata/empty.bin", largefile, ::std::filesystem::copy_options::overwrite_existing));
    }